

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O1

void __thiscall
OpenMD::SelectionSet::flip(SelectionSet *this,vector<int,_std::allocator<int>_> *bitIndex)

{
  pointer piVar1;
  pointer pOVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  pOVar2 = (this->bitsets_).
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (bitIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar3 = 0;
  do {
    uVar4 = (ulong)piVar1[lVar3];
    uVar5 = uVar4 + 0x3f;
    if (-1 < (long)uVar4) {
      uVar5 = uVar4;
    }
    lVar6 = ((long)uVar5 >> 6) * 8 +
            *(long *)&(pOVar2->bitset_).super__Bvector_base<std::allocator<bool>_>;
    uVar7 = (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001);
    uVar5 = *(ulong *)(lVar6 + -8 + uVar7 * 8);
    uVar8 = uVar5 | 1L << (uVar4 & 0x3f);
    if ((uVar5 >> (uVar4 & 0x3f) & 1) != 0) {
      uVar8 = uVar5 & ~(1L << (uVar4 & 0x3f));
    }
    *(ulong *)(lVar6 + -8 + uVar7 * 8) = uVar8;
    lVar3 = lVar3 + 1;
    pOVar2 = pOVar2 + 1;
  } while (lVar3 != 6);
  return;
}

Assistant:

void SelectionSet::flip(std::vector<int> bitIndex) {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i].flip(bitIndex[i]);
  }